

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example8.cpp
# Opt level: O0

int main(void)

{
  Medium med;
  LightSource *pLVar1;
  Scene *pSVar2;
  Sphere *this;
  Bumps *this_00;
  PointLight *this_01;
  Vector local_110;
  Vector local_f8;
  Vector local_e0;
  Vector local_c8;
  Vector local_b0;
  Vector local_98;
  Vector local_80;
  double local_68;
  double dStack_60;
  Vector local_50;
  Scene *local_28;
  Scene *scene;
  LightSource *Light2;
  LightSource *Light1;
  Sphere *Sphere1;
  
  pSVar2 = (Scene *)operator_new(0xe8);
  Scene::Scene(pSVar2);
  local_28 = pSVar2;
  this = (Sphere *)operator_new(200);
  Vector::Vector(&local_50,0.0,0.0,0.0);
  Sphere::Sphere(this,&local_50,4.0);
  Light1 = (LightSource *)this;
  GeometricObject::ambient((GeometricObject *)this,0.3);
  GeometricObject::diffuse((GeometricObject *)Light1,0.2);
  GeometricObject::specular((GeometricObject *)Light1,0.7);
  GeometricObject::reflection((GeometricObject *)Light1,0.0);
  GeometricObject::ior((GeometricObject *)Light1,0.0);
  GeometricObject::phong_size((GeometricObject *)Light1,0x1e);
  local_68 = Grayzer::Medium::glass.ior;
  dStack_60 = Grayzer::Medium::glass.beta;
  med.beta = Grayzer::Medium::glass.beta;
  med.ior = Grayzer::Medium::glass.ior;
  GeometricObject::medium((GeometricObject *)Light1,med);
  pLVar1 = Light1;
  Vector::Vector(&local_80,1.0,0.0,0.0);
  GeometricObject::color((GeometricObject *)pLVar1,&local_80);
  pLVar1 = Light1;
  this_00 = (Bumps *)operator_new(0x60);
  Bumps::Bumps(this_00,7.0);
  GeometricObject::add((GeometricObject *)pLVar1,(Texture *)this_00);
  this_01 = (PointLight *)operator_new(0x40);
  Vector::Vector(&local_98,-10.0,8.0,-20.0);
  PointLight::PointLight(this_01,&local_98,20.0);
  Light2 = (LightSource *)this_01;
  pSVar2 = (Scene *)operator_new(0x40);
  Vector::Vector(&local_b0,10.0,8.0,-20.0);
  PointLight::PointLight((PointLight *)pSVar2,&local_b0,20.0);
  scene = pSVar2;
  Scene::add(local_28,(GeometricObject *)Light1);
  Scene::add(local_28,Light2);
  Scene::add(local_28,(LightSource *)scene);
  pSVar2 = local_28;
  Vector::Vector(&local_c8,0.196078,0.6,0.8);
  Scene::setBackground(pSVar2,&local_c8);
  init_noise();
  pSVar2 = local_28;
  Vector::Vector(&local_e0,0.0,0.0,-7.0);
  Vector::Vector(&local_f8,0.0,0.0,1.0);
  Vector::Vector(&local_110,0.0,1.0,0.0);
  Scene::setCamera(pSVar2,&local_e0,&local_f8,&local_110);
  render_scene(local_28,1.5,1.0,300,200,"SAMPLE80.TGA");
  done_noise();
  return 0;
}

Assistant:

int main()
{
    Sphere* Sphere1;
    LightSource *Light1,*Light2;

    Scene* scene = new Scene;
    Sphere1 = new Sphere(Vector(0,0,0),4);

    Sphere1->ambient(0.3);
    Sphere1->diffuse(0.2);
    Sphere1->specular(0.7);
    Sphere1->reflection(0.0);
    Sphere1->ior(0.0);
    Sphere1->phong_size(30);
    Sphere1->medium(Grayzer::Medium::glass);
    Sphere1->color(Red);
    Sphere1->add(new Bumps(7.0));

    Light1 = new PointLight(Vector(-10,8,-20),20);
    Light2 = new PointLight(Vector(10,8,-20),20);

    scene->add(Sphere1);
    scene->add(Light1);
    scene->add(Light2);

    scene->setBackground(SkyBlue);

    init_noise();
    scene->setCamera(Vector(0,0,-7),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.5,1.0,300,200,"SAMPLE80.TGA");
    done_noise();
}